

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListGraph.c
# Opt level: O2

EData * get_edges(LGraph G)

{
  int iVar1;
  EData *pEVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ENode **ppEVar6;
  ENode **ppEVar7;
  uint in_stack_00000008;
  int in_stack_0000000c;
  
  pEVar2 = (EData *)malloc((long)in_stack_0000000c << 3);
  uVar4 = 0;
  uVar3 = (ulong)in_stack_00000008;
  if ((int)in_stack_00000008 < 1) {
    uVar3 = uVar4;
  }
  iVar5 = 0;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    ppEVar6 = &G.vexs[uVar4 - 1].first_edge;
    ppEVar7 = ppEVar6;
    while (ppEVar7 = (ENode **)ppEVar7[1], ppEVar7 != (ENode **)0x0) {
      iVar1 = *(int *)ppEVar7;
      if ((long)uVar4 < (long)iVar1) {
        pEVar2[iVar5].start = *(char *)ppEVar6;
        pEVar2[iVar5].end = *(char *)&G.vexs[(long)iVar1 + -1].first_edge;
        pEVar2[iVar5].weight = *(int *)((long)ppEVar7 + 4);
        iVar5 = iVar5 + 1;
      }
    }
  }
  return pEVar2;
}

Assistant:

EData* get_edges(LGraph G)
{
    int i,j;
    int index=0;
    ENode *node;
    EData *edges;

    edges = (EData*)malloc(G.edgnum*sizeof(EData));
    for (i=0; i<G.vexnum; i++)
    {
        node = G.vexs[i].first_edge;
        while (node != NULL)
        {
            if (node->ivex > i)
            {
                edges[index].start  = G.vexs[i].data;           // 起点
                edges[index].end    = G.vexs[node->ivex].data;  // 终点
                edges[index].weight = node->weight;             // 权
                index++;
            }
            node = node->next_edge;
        }
    }

    return edges;
}